

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int gen_publickey_from_dsa_evp
              (LIBSSH2_SESSION *session,uchar **method,size_t *method_len,uchar **pubkeydata,
              size_t *pubkeydata_len,EVP_PKEY *pk)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  dsa_st *r;
  uchar *puVar5;
  uchar *buf;
  uchar *puVar6;
  int iVar7;
  BIGNUM *local_78;
  BIGNUM *g;
  ulong local_68;
  uchar **local_60;
  size_t *local_58;
  uchar **local_50;
  size_t *local_48;
  BIGNUM *q;
  BIGNUM *p_bn;
  
  r = EVP_PKEY_get1_DSA((EVP_PKEY *)pk);
  if (r != (dsa_st *)0x0) {
    puVar5 = (uchar *)(*session->alloc)(7,&session->abstract);
    if (puVar5 == (uchar *)0x0) {
      DSA_free(r);
    }
    else {
      local_60 = method;
      local_58 = method_len;
      local_50 = pubkeydata;
      local_48 = pubkeydata_len;
      DSA_get0_pqg(r,&p_bn,&q,&g);
      DSA_get0_key(r,&local_78,0);
      iVar2 = BN_num_bits((BIGNUM *)p_bn);
      uVar1 = (long)(iVar2 + 7) / 8;
      iVar2 = BN_num_bits((BIGNUM *)q);
      iVar2 = (iVar2 + 7) / 8;
      iVar3 = BN_num_bits((BIGNUM *)g);
      iVar3 = (iVar3 + 7) / 8;
      iVar4 = BN_num_bits(local_78);
      iVar4 = (iVar4 + 7) / 8;
      local_68 = uVar1 & 0xffffffff;
      buf = (uchar *)(*session->alloc)((long)(iVar3 + (int)uVar1 + iVar2 + iVar4 + 0x1f),
                                       &session->abstract);
      if (buf != (uchar *)0x0) {
        iVar7 = (int)local_68;
        _libssh2_htonu32(buf,7);
        builtin_memcpy(buf + 4,"ssh-dss",7);
        puVar6 = write_bn(buf + 0xb,p_bn,iVar7 + 1);
        puVar6 = write_bn(puVar6,q,iVar2 + 1);
        puVar6 = write_bn(puVar6,g,iVar3 + 1);
        puVar6 = write_bn(puVar6,(BIGNUM *)local_78,iVar4 + 1);
        DSA_free(r);
        builtin_memcpy(puVar5,"ssh-dss",7);
        *local_60 = puVar5;
        *local_58 = 7;
        *local_50 = buf;
        *local_48 = (long)puVar6 - (long)buf;
        return 0;
      }
      DSA_free(r);
      if (puVar5 != (uchar *)0x0) {
        (*session->free)(puVar5,&session->abstract);
      }
    }
  }
  iVar2 = _libssh2_error(session,-6,"Unable to allocate memory for private key data");
  return iVar2;
}

Assistant:

static int
gen_publickey_from_dsa_evp(LIBSSH2_SESSION *session,
                           unsigned char **method,
                           size_t *method_len,
                           unsigned char **pubkeydata,
                           size_t *pubkeydata_len,
                           EVP_PKEY *pk)
{
    DSA*           dsa = NULL;
    unsigned char* key;
    unsigned char* method_buf = NULL;
    size_t  key_len;

    _libssh2_debug(session,
                   LIBSSH2_TRACE_AUTH,
                   "Computing public key from DSA private key envelop");

    dsa = EVP_PKEY_get1_DSA(pk);
    if (dsa == NULL) {
        /* Assume memory allocation error... what else could it be ? */
        goto __alloc_error;
    }

    method_buf = LIBSSH2_ALLOC(session, 7);  /* ssh-dss. */
    if (method_buf == NULL) {
        goto __alloc_error;
    }

    key = gen_publickey_from_dsa(session, dsa, &key_len);
    if (key == NULL) {
        goto __alloc_error;
    }
    DSA_free(dsa);

    memcpy(method_buf, "ssh-dss", 7);
    *method         = method_buf;
    *method_len     = 7;
    *pubkeydata     = key;
    *pubkeydata_len = key_len;
    return 0;

  __alloc_error:
    if (dsa != NULL) {
        DSA_free(dsa);
    }
    if (method_buf != NULL) {
        LIBSSH2_FREE(session, method_buf);
    }

    return _libssh2_error(session,
                          LIBSSH2_ERROR_ALLOC,
                          "Unable to allocate memory for private key data");
}